

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  lVar8 = *(long *)(this + 0x10);
  if (lVar8 != 0) {
    pwVar6 = *it;
    if (0 < lVar8) {
      pcVar9 = *(char **)(this + 8);
      lVar8 = lVar8 + 1;
      do {
        *pwVar6 = (int)*pcVar9;
        pcVar9 = pcVar9 + 1;
        pwVar6 = pwVar6 + 1;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    *it = pwVar6;
  }
  auVar5 = _DAT_00165200;
  auVar4 = _DAT_001651f0;
  auVar3 = _DAT_001651e0;
  pwVar7 = *it;
  lVar8 = *(long *)(this + 0x20);
  pwVar6 = pwVar7;
  if (lVar8 != 0) {
    pwVar6 = pwVar7 + lVar8;
    wVar1 = *(wchar_t *)(this + 0x18);
    uVar11 = lVar8 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar13._8_4_ = (int)uVar11;
    auVar13._0_8_ = uVar11;
    auVar13._12_4_ = (int)(uVar11 >> 0x20);
    lVar12 = 0;
    auVar13 = auVar13 ^ _DAT_00165200;
    do {
      auVar15._8_4_ = (int)lVar12;
      auVar15._0_8_ = lVar12;
      auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar16 = (auVar15 | auVar4) ^ auVar5;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar14 < auVar16._4_4_) & 1)) {
        pwVar7[lVar12] = wVar1;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        pwVar7[lVar12 + 1] = wVar1;
      }
      auVar15 = (auVar15 | auVar3) ^ auVar5;
      iVar17 = auVar15._4_4_;
      if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar15._0_4_ <= auVar13._0_4_)) {
        pwVar7[lVar12 + 2] = wVar1;
        pwVar7[lVar12 + 3] = wVar1;
      }
      lVar12 = lVar12 + 4;
    } while ((uVar11 - ((uint)(lVar8 + 0x3fffffffffffffffU) & 3)) + 4 != lVar12);
  }
  *it = pwVar6;
  iVar14 = *(int *)(this + 0x2c);
  pwVar7 = pwVar6 + iVar14;
  uVar10 = *(uint *)(this + 0x28);
  do {
    pwVar7 = pwVar7 + -1;
    *pwVar7 = uVar10 & 7 | 0x30;
    bVar2 = 7 < uVar10;
    uVar10 = uVar10 >> 3;
  } while (bVar2);
  *it = pwVar6 + iVar14;
  return;
}

Assistant:

FMT_CONSTEXPR iterator begin() const { return data_; }